

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h262.c
# Opt level: O0

int h262_seqparm(bitstream *str,h262_seqparm *seqparm)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint *in_RSI;
  int *in_RDI;
  int i;
  uint32_t vbv;
  uint32_t br;
  uint32_t vs;
  uint32_t hs;
  uint32_t in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  uint32_t in_stack_ffffffffffffffd4;
  int local_4;
  
  uVar1 = *in_RSI;
  uVar2 = in_RSI[1];
  uVar3 = in_RSI[4] & 0x3ffff;
  uVar4 = in_RSI[5] & 0x3ff;
  if ((*in_RDI == 0) && (in_RSI[0x89] == 0)) {
    if ((uVar1 & 0xfff) != *in_RSI) {
      fprintf(_stderr,"horizontal_size too big for MPEG1\n");
      return 1;
    }
    if ((uVar2 & 0xfff) != in_RSI[1]) {
      fprintf(_stderr,"vertical_size too big for MPEG1\n");
      return 1;
    }
    if (uVar3 != in_RSI[4]) {
      fprintf(_stderr,"bit_rate too big for MPEG1\n");
      return 1;
    }
    if (uVar4 != in_RSI[5]) {
      fprintf(_stderr,"vbv_buffer_size too big for MPEG1\n");
      return 1;
    }
  }
  iVar5 = vs_u((bitstream *)(CONCAT44(in_RSI[4],in_RSI[5]) & 0x3ffff000003ff),
               (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc);
  if (iVar5 == 0) {
    iVar5 = vs_u((bitstream *)CONCAT44(uVar3,uVar4),
                 (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffcc);
    if (iVar5 == 0) {
      iVar5 = vs_u((bitstream *)CONCAT44(uVar3,uVar4),
                   (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc);
      if (iVar5 == 0) {
        iVar5 = vs_u((bitstream *)CONCAT44(uVar3,uVar4),
                     (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                     in_stack_ffffffffffffffcc);
        if (iVar5 == 0) {
          iVar5 = vs_u((bitstream *)CONCAT44(uVar3,uVar4),
                       (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                       in_stack_ffffffffffffffcc);
          if (iVar5 == 0) {
            iVar5 = vs_mark((bitstream *)CONCAT44(uVar3,uVar4),in_stack_ffffffffffffffd4,
                            in_stack_ffffffffffffffd0);
            if (iVar5 == 0) {
              iVar5 = vs_u((bitstream *)CONCAT44(uVar3,uVar4),
                           (uint32_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                           ,in_stack_ffffffffffffffcc);
              if (iVar5 == 0) {
                iVar5 = vs_u((bitstream *)CONCAT44(uVar3,uVar4),
                             (uint32_t *)
                             CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                             in_stack_ffffffffffffffcc);
                if (iVar5 == 0) {
                  iVar5 = vs_u((bitstream *)CONCAT44(uVar3,uVar4),
                               (uint32_t *)
                               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                               in_stack_ffffffffffffffcc);
                  if (iVar5 == 0) {
                    if (in_RSI[7] != 0) {
                      for (in_stack_ffffffffffffffd4 = 0; (int)in_stack_ffffffffffffffd4 < 0x40;
                          in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1) {
                        iVar5 = vs_u((bitstream *)CONCAT44(uVar3,uVar4),
                                     (uint32_t *)
                                     CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                     in_stack_ffffffffffffffcc);
                        if (iVar5 != 0) {
                          return 1;
                        }
                      }
                    }
                    iVar5 = vs_u((bitstream *)CONCAT44(uVar3,uVar4),
                                 (uint32_t *)
                                 CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
                                 in_stack_ffffffffffffffcc);
                    if (iVar5 == 0) {
                      if (in_RSI[0x48] != 0) {
                        for (in_stack_ffffffffffffffd4 = 0; (int)in_stack_ffffffffffffffd4 < 0x40;
                            in_stack_ffffffffffffffd4 = in_stack_ffffffffffffffd4 + 1) {
                          iVar5 = vs_u((bitstream *)CONCAT44(uVar3,uVar4),
                                       (uint32_t *)
                                       CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0)
                                       ,in_stack_ffffffffffffffcc);
                          if (iVar5 != 0) {
                            return 1;
                          }
                        }
                      }
                      if (*in_RDI == 1) {
                        *in_RSI = uVar1 & 0xfff;
                        in_RSI[1] = uVar2 & 0xfff;
                        in_RSI[4] = uVar3;
                        in_RSI[5] = uVar4;
                        in_RSI[0x89] = 0;
                        in_RSI[0x90] = 0;
                      }
                      if (in_RSI[0x89] == 0) {
                        iVar5 = vs_infer((bitstream *)CONCAT44(uVar3,uVar4),
                                         (uint32_t *)
                                         CONCAT44(in_stack_ffffffffffffffd4,
                                                  in_stack_ffffffffffffffd0),
                                         in_stack_ffffffffffffffcc);
                        if (iVar5 != 0) {
                          return 1;
                        }
                        iVar5 = vs_infer((bitstream *)CONCAT44(uVar3,uVar4),
                                         (uint32_t *)
                                         CONCAT44(in_stack_ffffffffffffffd4,
                                                  in_stack_ffffffffffffffd0),
                                         in_stack_ffffffffffffffcc);
                        if (iVar5 != 0) {
                          return 1;
                        }
                        iVar5 = vs_infer((bitstream *)CONCAT44(uVar3,uVar4),
                                         (uint32_t *)
                                         CONCAT44(in_stack_ffffffffffffffd4,
                                                  in_stack_ffffffffffffffd0),
                                         in_stack_ffffffffffffffcc);
                        if (iVar5 != 0) {
                          return 1;
                        }
                        iVar5 = vs_infer((bitstream *)CONCAT44(uVar3,uVar4),
                                         (uint32_t *)
                                         CONCAT44(in_stack_ffffffffffffffd4,
                                                  in_stack_ffffffffffffffd0),
                                         in_stack_ffffffffffffffcc);
                        if (iVar5 != 0) {
                          return 1;
                        }
                        iVar5 = vs_infer((bitstream *)CONCAT44(uVar3,uVar4),
                                         (uint32_t *)
                                         CONCAT44(in_stack_ffffffffffffffd4,
                                                  in_stack_ffffffffffffffd0),
                                         in_stack_ffffffffffffffcc);
                        if (iVar5 != 0) {
                          return 1;
                        }
                        iVar5 = vs_infer((bitstream *)CONCAT44(uVar3,uVar4),
                                         (uint32_t *)
                                         CONCAT44(in_stack_ffffffffffffffd4,
                                                  in_stack_ffffffffffffffd0),
                                         in_stack_ffffffffffffffcc);
                        if (iVar5 != 0) {
                          return 1;
                        }
                      }
                      local_4 = 0;
                    }
                    else {
                      local_4 = 1;
                    }
                  }
                  else {
                    local_4 = 1;
                  }
                }
                else {
                  local_4 = 1;
                }
              }
              else {
                local_4 = 1;
              }
            }
            else {
              local_4 = 1;
            }
          }
          else {
            local_4 = 1;
          }
        }
        else {
          local_4 = 1;
        }
      }
      else {
        local_4 = 1;
      }
    }
    else {
      local_4 = 1;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int h262_seqparm(struct bitstream *str, struct h262_seqparm *seqparm) {
	uint32_t hs = seqparm->horizontal_size & 0xfff;
	uint32_t vs = seqparm->vertical_size & 0xfff;
	uint32_t br = seqparm->bit_rate & 0x3ffff;
	uint32_t vbv = seqparm->vbv_buffer_size & 0x3ff;
	int i;
	if (str->dir == VS_ENCODE && !seqparm->is_ext) {
		if (hs != seqparm->horizontal_size) {
			fprintf(stderr, "horizontal_size too big for MPEG1\n");
			return 1;
		}
		if (vs != seqparm->vertical_size) {
			fprintf(stderr, "vertical_size too big for MPEG1\n");
			return 1;
		}
		if (br != seqparm->bit_rate) {
			fprintf(stderr, "bit_rate too big for MPEG1\n");
			return 1;
		}
		if (vbv != seqparm->vbv_buffer_size) {
			fprintf(stderr, "vbv_buffer_size too big for MPEG1\n");
			return 1;
		}
	}
	if (vs_u(str, &hs, 12)) return 1;
	if (vs_u(str, &vs, 12)) return 1;
	if (vs_u(str, &seqparm->aspect_ratio_information, 4)) return 1;
	if (vs_u(str, &seqparm->frame_rate_code, 4)) return 1;
	if (vs_u(str, &br, 18)) return 1;
	if (vs_mark(str, 1, 1)) return 1;
	if (vs_u(str, &vbv, 10)) return 1;
	if (vs_u(str, &seqparm->constrained_parameters_flag, 1)) return 1;
	if (vs_u(str, &seqparm->load_intra_quantiser_matrix, 1)) return 1;
	if (seqparm->load_intra_quantiser_matrix) {
		for (i = 0; i < 64; i++)
			if (vs_u(str, &seqparm->intra_quantiser_matrix[i], 8)) return 1;
	}
	if (vs_u(str, &seqparm->load_non_intra_quantiser_matrix, 1)) return 1;
	if (seqparm->load_non_intra_quantiser_matrix) {
		for (i = 0; i < 64; i++)
			if (vs_u(str, &seqparm->non_intra_quantiser_matrix[i], 8)) return 1;
	}
	if (str->dir == VS_DECODE) {
		seqparm->horizontal_size = hs;
		seqparm->vertical_size = vs;
		seqparm->bit_rate = br;
		seqparm->vbv_buffer_size = vbv;
		seqparm->is_ext = 0;
		seqparm->has_disp_ext = 0;
	}
	if (!seqparm->is_ext) {
		if (vs_infer(str, &seqparm->progressive_sequence, 1)) return 1;
		if (vs_infer(str, &seqparm->chroma_format, 1)) return 1;
		if (vs_infer(str, &seqparm->low_delay, 0)) return 1;
		if (vs_infer(str, &seqparm->low_delay, 0)) return 1;
		if (vs_infer(str, &seqparm->frame_rate_extension_n, 0)) return 1;
		if (vs_infer(str, &seqparm->frame_rate_extension_d, 0)) return 1;
	}
	return 0;
}